

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

csc * csc_to_triu(csc *M)

{
  long lVar1;
  long values;
  csc *pcVar2;
  long in_RDI;
  c_int z_M;
  c_int j;
  c_int i;
  c_int ptr;
  c_int n;
  c_int nnzmaxM;
  c_int nnzorigM;
  csc *M_triu;
  csc *M_trip;
  c_int local_58;
  long local_50;
  long local_40;
  long triplet;
  c_int in_stack_ffffffffffffffe0;
  c_int in_stack_ffffffffffffffe8;
  csc *local_8;
  
  local_58 = 0;
  if (*(long *)(in_RDI + 8) == *(long *)(in_RDI + 0x10)) {
    triplet = *(long *)(in_RDI + 0x10);
    lVar1 = *(long *)(*(long *)(in_RDI + 0x18) + triplet * 8);
    values = lVar1 + triplet;
    pcVar2 = csc_spalloc(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,lVar1,values,triplet);
    if (pcVar2 == (csc *)0x0) {
      printf("ERROR in %s: ","csc_to_triu");
      printf("Upper triangular matrix extraction failed (out of memory)");
      printf("\n");
      local_8 = (csc *)0x0;
    }
    else {
      for (local_50 = 0; local_50 < triplet; local_50 = local_50 + 1) {
        for (local_40 = *(long *)(*(long *)(in_RDI + 0x18) + local_50 * 8);
            local_40 < *(long *)(*(long *)(in_RDI + 0x18) + 8 + local_50 * 8);
            local_40 = local_40 + 1) {
          lVar1 = *(long *)(*(long *)(in_RDI + 0x20) + local_40 * 8);
          if (lVar1 <= local_50) {
            pcVar2->i[local_58] = lVar1;
            pcVar2->p[local_58] = local_50;
            pcVar2->x[local_58] = *(c_float *)(*(long *)(in_RDI + 0x28) + local_40 * 8);
            local_58 = local_58 + 1;
          }
        }
      }
      pcVar2->nz = local_58;
      local_8 = triplet_to_csc((csc *)ptr,(c_int *)i);
      local_8->nzmax = values;
      csc_spfree((csc *)0x275340);
    }
  }
  else {
    printf("ERROR in %s: ","csc_to_triu");
    printf("Matrix M not square");
    printf("\n");
    local_8 = (csc *)0x0;
  }
  return local_8;
}

Assistant:

csc* csc_to_triu(csc *M) {
  csc  *M_trip;    // Matrix in triplet format
  csc  *M_triu;    // Resulting upper triangular matrix
  c_int nnzorigM;  // Number of nonzeros from original matrix M
  c_int nnzmaxM;   // Estimated maximum number of elements of upper triangular M
  c_int n;         // Dimension of M
  c_int ptr, i, j; // Counters for (i,j) and index in M
  c_int z_M = 0;   // Counter for elements in M_trip


  // Check if matrix is square
  if (M->m != M->n) {
#ifdef PRINTING
    c_eprint("Matrix M not square");
#endif /* ifdef PRINTING */
    return OSQP_NULL;
  }
  n = M->n;

  // Get number of nonzeros full M
  nnzorigM = M->p[n];

  // Estimate nnzmaxM
  // Number of nonzero elements in original M + diagonal part.
  // -> Full matrix M as input: estimate is half the number of total elements +
  // diagonal = .5 * (nnzorigM + n)
  // -> Upper triangular matrix M as input: estimate is the number of total
  // elements + diagonal = nnzorigM + n
  // The maximum between the two is nnzorigM + n
  nnzmaxM = nnzorigM + n;

  // OLD
  // nnzmaxM = n*(n+1)/2;  // Full upper triangular matrix (This version
  // allocates too much memory!)
  // nnzmaxM = .5 * (nnzorigM + n);  // half of the total elements + diagonal

  // Allocate M_trip
  M_trip = csc_spalloc(n, n, nnzmaxM, 1, 1); // Triplet format

  if (!M_trip) {
#ifdef PRINTING
    c_eprint("Upper triangular matrix extraction failed (out of memory)");
#endif /* ifdef PRINTING */
    return OSQP_NULL;
  }

  // Fill M_trip with only elements in M which are in the upper triangular
  for (j = 0; j < n; j++) { // Cycle over columns
    for (ptr = M->p[j]; ptr < M->p[j + 1]; ptr++) {
      // Get row index
      i = M->i[ptr];

      // Assign element only if in the upper triangular
      if (i <= j) {
        // c_print("\nM(%i, %i) = %.4f", M->i[ptr], j, M->x[ptr]);

        M_trip->i[z_M] = i;
        M_trip->p[z_M] = j;
        M_trip->x[z_M] = M->x[ptr];

        // Increase counter for the number of elements
        z_M++;
      }
    }
  }

  // Set number of nonzeros
  M_trip->nz = z_M;

  // Convert triplet matrix to csc format
  M_triu = triplet_to_csc(M_trip, OSQP_NULL);

  // Assign number of nonzeros of full matrix to triu M
  M_triu->nzmax = nnzmaxM;

  // Cleanup and return result
  csc_spfree(M_trip);

  // Return matrix in triplet form
  return M_triu;
}